

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

void FinishDehPatch(void)

{
  PClassActor *this;
  PNativeStruct *pPVar1;
  PClass *this_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  PClassActor **ppPVar5;
  char *pcVar6;
  char *pcVar7;
  bool *pbVar8;
  DObject *p_00;
  Variant *pVVar9;
  int local_130;
  FName local_12c;
  int use;
  PFunction *p;
  bool *pbStack_118;
  uint j;
  bool *check;
  FState *local_108;
  FState *state;
  TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> StateVisited;
  TFlags<ActorFlag6,_unsigned_int> local_e0;
  byte local_d9;
  AActor *pAStack_d8;
  bool found;
  AWeapon *weap;
  PClassActor *pPStack_c8;
  uint i;
  PClassActor *old_replacement;
  undefined1 local_b0 [8];
  FStateDefinitions statedef;
  AActor *defaults2;
  char local_58 [8];
  char typeNameBuilder [32];
  TFlags<ActorFlag,_unsigned_int> local_2c;
  AActor *local_28;
  AActor *defaults1;
  PClassActor *type;
  PClassActor *subclass;
  uint nameindex;
  uint touchedIndex;
  
  subclass._0_4_ = 0;
  for (subclass._4_4_ = 0; uVar4 = subclass._4_4_,
      uVar3 = TArray<PClassActor_*,_PClassActor_*>::Size(&TouchedActors), uVar4 < uVar3;
      subclass._4_4_ = subclass._4_4_ + 1) {
    ppPVar5 = TArray<PClassActor_*,_PClassActor_*>::operator[](&TouchedActors,(ulong)subclass._4_4_)
    ;
    defaults1 = (AActor *)*ppPVar5;
    local_28 = GetDefaultByType((PClass *)defaults1);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_2c,
               (int)local_28 +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
    if (uVar4 != 0) {
      do {
        subclass._0_4_ = (int)subclass + 1;
        mysnprintf(local_58,0x20,"DehackedPickup%d");
        this_00 = ADehackedPickup::RegistrationInfo.MyClass;
        FName::FName((FName *)((long)&defaults2 + 4),local_58);
        type = (PClassActor *)
               PClass::CreateDerivedClass(this_00,(FName *)((long)&defaults2 + 4),0x510);
      } while (type == (PClassActor *)0x0);
      statedef.SourceLines._8_8_ = GetDefaultByType((PClass *)type);
      memcpy((void *)statedef.SourceLines._8_8_,local_28,0x4c0);
      FStateDefinitions::FStateDefinitions((FStateDefinitions *)local_b0);
      FStateDefinitions::MakeStateDefines((FStateDefinitions *)local_b0,(PClassActor *)defaults1);
      bVar2 = PClass::IsDescendantOf((PClass *)defaults1,AInventory::RegistrationInfo.MyClass);
      if (!bVar2) {
        FStateDefinitions::AddStateDefines
                  ((FStateDefinitions *)local_b0,
                   *(FStateLabels **)
                    &AInventory::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.
                     super_PNamedType.super_PCompoundType.super_PType.Align);
      }
      FStateDefinitions::InstallStates
                ((FStateDefinitions *)local_b0,type,(AActor *)statedef.SourceLines._8_8_);
      pPStack_c8 = (PClassActor *)defaults1->Alpha;
      defaults1->Alpha = (double)type;
      type->Replacee = (PClassActor *)defaults1;
      if (pPStack_c8 != (PClassActor *)0x0) {
        type->Replacement = pPStack_c8;
      }
      pcVar6 = FName::GetChars(&(type->super_PClass).super_PNativeStruct.super_PStruct.
                                super_PNamedType.TypeName);
      pcVar7 = FName::GetChars((FName *)&defaults1->VisibleEndPitch);
      DPrintf(3,"%s replaces %s\n",pcVar6,pcVar7);
      FStateDefinitions::~FStateDefinitions((FStateDefinitions *)local_b0);
    }
  }
  TArray<StateMapper,_StateMapper>::Clear(&StateMap);
  TArray<StateMapper,_StateMapper>::ShrinkToFit(&StateMap);
  TArray<PClassActor_*,_PClassActor_*>::Clear(&TouchedActors);
  TArray<PClassActor_*,_PClassActor_*>::ShrinkToFit(&TouchedActors);
  weap._4_4_ = 0;
  do {
    uVar4 = weap._4_4_;
    uVar3 = TArray<PClassActor_*,_PClassActor_*>::Size(&WeaponNames);
    if (uVar3 <= uVar4) {
      TArray<PClassActor_*,_PClassActor_*>::Clear(&WeaponNames);
      TArray<PClassActor_*,_PClassActor_*>::ShrinkToFit(&WeaponNames);
      return;
    }
    ppPVar5 = TArray<PClassActor_*,_PClassActor_*>::operator[](&WeaponNames,(ulong)weap._4_4_);
    pAStack_d8 = GetDefaultByType(&(*ppPVar5)->super_PClass);
    local_d9 = 0;
    TFlags<ActorFlag6,_unsigned_int>::operator&
              (&local_e0,
               (int)pAStack_d8 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e0);
    if (uVar4 == 0) {
      *(uint *)((long)&pAStack_d8[1].snext + 4) =
           *(uint *)((long)&pAStack_d8[1].snext + 4) | 0x10000;
      *(undefined4 *)&pAStack_d8[1].OldRenderPos.X = 0;
      TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::TMap
                ((TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> *)&state);
      ppPVar5 = TArray<PClassActor_*,_PClassActor_*>::operator[](&WeaponNames,(ulong)weap._4_4_);
      this = *ppPVar5;
      FName::FName((FName *)((long)&check + 4),NAME_Fire);
      local_108 = PClassActor::FindState(this,(FName *)((long)&check + 4));
      while ((local_108 != (FState *)0x0 &&
             ((pbStack_118 = TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::
                             CheckKey((TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>
                                       *)&state,local_108), pbStack_118 == (bool *)0x0 ||
              ((*pbStack_118 & 1U) == 0))))) {
        pbVar8 = TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::operator[]
                           ((TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> *)
                            &state,local_108);
        *pbVar8 = true;
        p._4_4_ = 0;
        while (AmmoPerAttacks[p._4_4_].func != NAME_None) {
          if (AmmoPerAttacks[p._4_4_].ptr == (VMFunction *)0x0) {
            pPVar1 = &(AStateProvider::RegistrationInfo.MyClass)->super_PNativeStruct;
            FName::FName(&local_12c,AmmoPerAttacks[p._4_4_].func);
            p_00 = (DObject *)
                   PSymbolTable::FindSymbol
                             (&(pPVar1->super_PStruct).super_PNamedType.super_PCompoundType.
                               super_PType.Symbols,&local_12c,true);
            _use = dyn_cast<PFunction>(p_00);
            if (_use != (PFunction *)0x0) {
              pVVar9 = TArray<PFunction::Variant,_PFunction::Variant>::operator[](&_use->Variants,0)
              ;
              AmmoPerAttacks[p._4_4_].ptr = pVVar9->Implementation;
            }
          }
          if (local_108->ActionFunc == AmmoPerAttacks[p._4_4_].ptr) {
            local_d9 = 1;
            local_130 = AmmoPerAttacks[p._4_4_].ammocount;
            if (local_130 < 0) {
              local_130 = deh.BFGCells;
            }
            *(int *)&pAStack_d8[1].OldRenderPos.X = local_130;
            break;
          }
          p._4_4_ = p._4_4_ + 1;
        }
        if ((local_d9 & 1) != 0) break;
        local_108 = FState::GetNextState(local_108);
      }
      TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::~TMap
                ((TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> *)&state);
    }
    else {
      operator~((int)&StateVisited + (MF6_NOFEAR|MF6_MTHRUSPECIES));
      TFlags<ActorFlag6,_unsigned_int>::operator&=
                (&pAStack_d8->flags6,(Self *)&StateVisited.NumUsed);
    }
    weap._4_4_ = weap._4_4_ + 1;
  } while( true );
}

Assistant:

void FinishDehPatch ()
{
	unsigned int touchedIndex;
	unsigned int nameindex = 0;

	for (touchedIndex = 0; touchedIndex < TouchedActors.Size(); ++touchedIndex)
	{
		PClassActor *subclass;
		PClassActor *type = TouchedActors[touchedIndex];
		AActor *defaults1 = GetDefaultByType (type);
		if (!(defaults1->flags & MF_SPECIAL))
		{ // We only need to do this for pickups
			continue;
		}

		// Create a new class that will serve as the actual pickup
		char typeNameBuilder[32];
		// 
		do
		{
			// Retry until we find a free name. This is unlikely to happen but not impossible.
			mysnprintf(typeNameBuilder, countof(typeNameBuilder), "DehackedPickup%d", nameindex++);
			subclass = static_cast<PClassActor *>(RUNTIME_CLASS(ADehackedPickup)->
				CreateDerivedClass(typeNameBuilder, sizeof(ADehackedPickup)));
		} 
		while (subclass == nullptr);
		
		AActor *defaults2 = GetDefaultByType (subclass);
		memcpy ((void *)defaults2, (void *)defaults1, sizeof(AActor));

		// Make a copy of the replaced class's state labels 
		FStateDefinitions statedef;
		statedef.MakeStateDefines(type);

		if (!type->IsDescendantOf(RUNTIME_CLASS(AInventory)))
		{
			// If this is a hacked non-inventory item we must also copy AInventory's special states
			statedef.AddStateDefines(RUNTIME_CLASS(AInventory)->StateList);
		}
		statedef.InstallStates(subclass, defaults2);

		// Use the DECORATE replacement feature to redirect all spawns
		// of the original class to the new one.
		PClassActor *old_replacement = type->Replacement;

		type->Replacement = subclass;
		subclass->Replacee = type;
		// If this actor was already replaced by another actor, copy that
		// replacement over to this item.
		if (old_replacement != NULL)
		{
			subclass->Replacement = old_replacement;
		}

		DPrintf (DMSG_NOTIFY, "%s replaces %s\n", subclass->TypeName.GetChars(), type->TypeName.GetChars());
	}

	// Now that all Dehacked patches have been processed, it's okay to free StateMap.
	StateMap.Clear();
	StateMap.ShrinkToFit();
	TouchedActors.Clear();
	TouchedActors.ShrinkToFit();

	// Now it gets nasty: We have to fiddle around with the weapons' ammo use info to make Doom's original
	// ammo consumption work as intended.

	for(unsigned i = 0; i < WeaponNames.Size(); i++)
	{
		AWeapon *weap = (AWeapon*)GetDefaultByType(WeaponNames[i]);
		bool found = false;
		if (weap->flags6 & MF6_INTRYMOVE)
		{
			// Weapon sets an explicit amount of ammo to use so we won't need any special processing here
			weap->flags6 &= ~MF6_INTRYMOVE;
		}
		else
		{
			weap->WeaponFlags |= WIF_DEHAMMO;
			weap->AmmoUse1 = 0;
			// to allow proper checks in CheckAmmo we have to find the first attack pointer in the Fire sequence
			// and set its default ammo use as the weapon's AmmoUse1.

			TMap<FState*, bool> StateVisited;

			FState *state = WeaponNames[i]->FindState(NAME_Fire);
			while (state != NULL)
			{
				bool *check = StateVisited.CheckKey(state);
				if (check != NULL && *check)
				{
					break;	// State has already been checked so we reached a loop
				}
				StateVisited[state] = true;
				for(unsigned j = 0; AmmoPerAttacks[j].func != NAME_None; j++)
				{
					if (AmmoPerAttacks[j].ptr == nullptr)
					{
						auto p = dyn_cast<PFunction>(RUNTIME_CLASS(AStateProvider)->Symbols.FindSymbol(AmmoPerAttacks[j].func, true));
						if (p != nullptr) AmmoPerAttacks[j].ptr = p->Variants[0].Implementation;
					}
					if (state->ActionFunc == AmmoPerAttacks[j].ptr)
					{
						found = true;
						int use = AmmoPerAttacks[j].ammocount;
						if (use < 0) use = deh.BFGCells;
						weap->AmmoUse1 = use;
						break;
					}
				}
				if (found) break;
				state = state->GetNextState();
			}
		}
	}
	WeaponNames.Clear();
	WeaponNames.ShrinkToFit();
}